

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

s32 __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
          (array<irr::CIrrDeviceSDL::SKeyMap> *this,SKeyMap *element,s32 left,s32 right)

{
  pointer pSVar1;
  pointer pSVar2;
  s32 sVar3;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  difference_type __d;
  long lVar7;
  
  sVar3 = -1;
  if (left <= right) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)left;
    pSVar4 = pSVar1 + lVar7;
    uVar6 = right - lVar7;
    if (uVar6 != 0 && lVar7 <= right) {
      do {
        uVar5 = uVar6 >> 1;
        uVar6 = ~uVar5 + uVar6;
        pSVar2 = pSVar4 + uVar5 + 1;
        if (element->SDLKey <= pSVar4[uVar5].SDLKey) {
          uVar6 = uVar5;
          pSVar2 = pSVar4;
        }
        pSVar4 = pSVar2;
      } while (0 < (long)uVar6);
    }
    if (element->SDLKey == pSVar4->SDLKey) {
      sVar3 = (s32)((ulong)((long)pSVar4 - (long)pSVar1) >> 3);
    }
  }
  return sVar3;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}